

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * getchaintips(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff708;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff710;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff740;
  allocator<char> *in_stack_fffffffffffff748;
  iterator in_stack_fffffffffffff750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff758;
  undefined8 in_stack_fffffffffffff768;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff770;
  undefined1 *puVar2;
  string *in_stack_fffffffffffff778;
  RPCResult *in_stack_fffffffffffff780;
  RPCResults *in_stack_fffffffffffff788;
  RPCResult *in_stack_fffffffffffff790;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  RPCHelpMan *this_00;
  undefined1 local_720 [35];
  allocator<char> local_6fd;
  allocator<char> local_6fc;
  allocator<char> local_6fb [3];
  pointer local_6f8;
  pointer pRStack_6f0;
  pointer local_6e8;
  allocator<char> local_6da;
  allocator<char> local_6d9;
  _Alloc_hider local_6d8;
  size_type sStack_6d0;
  undefined1 local_6c8 [15];
  allocator<char> local_6b9;
  _Alloc_hider local_6b8;
  size_type sStack_6b0;
  undefined1 local_6a8 [15];
  allocator<char> local_699;
  undefined8 local_698;
  RPCMethodImpl *fun;
  allocator<char> local_672;
  allocator<char> local_671 [31];
  allocator<char> local_652;
  undefined1 local_651 [31];
  undefined1 local_632;
  vector<RPCArg,_std::allocator<RPCArg>_> local_631;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined1 local_5fa [514];
  undefined1 local_3f8 [544];
  undefined1 local_1d8 [64];
  undefined1 local_198 [136];
  undefined1 local_110 [264];
  long local_8;
  
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff768 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  description = (string *)local_5fa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  local_618 = 0;
  uStack_610 = 0;
  local_608 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff708);
  args = &local_631;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  results = (RPCResults *)&local_632;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  examples = (RPCExamples *)local_651;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  local_698 = 0;
  fun = (RPCMethodImpl *)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff708);
  RPCResult::RPCResult
            (in_stack_fffffffffffff790,(Type)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (string *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  local_6b8._M_p = (pointer)0x0;
  sStack_6b0 = 0;
  local_6a8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff708);
  RPCResult::RPCResult
            (in_stack_fffffffffffff790,(Type)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (string *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  local_6d8._M_p = (pointer)0x0;
  sStack_6d0 = 0;
  local_6c8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff708);
  RPCResult::RPCResult
            (in_stack_fffffffffffff790,(Type)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (string *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  local_6f8 = (pointer)0x0;
  pRStack_6f0 = (pointer)0x0;
  local_6e8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff708);
  RPCResult::RPCResult
            (in_stack_fffffffffffff790,(Type)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (string *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770
             ,(bool)skip_type_check);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff708);
  __l._M_len = (size_type)in_stack_fffffffffffff758;
  __l._M_array = in_stack_fffffffffffff750;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff748,__l,
             (allocator_type *)in_stack_fffffffffffff740);
  RPCResult::RPCResult
            (in_stack_fffffffffffff790,(Type)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (string *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770
             ,(bool)skip_type_check);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff708);
  __l_00._M_len = (size_type)in_stack_fffffffffffff758;
  __l_00._M_array = in_stack_fffffffffffff750;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff748,__l_00,
             (allocator_type *)in_stack_fffffffffffff740);
  RPCResult::RPCResult
            (in_stack_fffffffffffff790,(Type)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (string *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  HelpExampleCli(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  HelpExampleRpc(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  std::operator+(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff708,(string *)0x558d8a);
  this = (RPCResult *)local_720;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getchaintips()::__0,void>(in_stack_fffffffffffff718,in_stack_fffffffffffff710);
  RPCHelpMan::RPCHelpMan(this_00,&in_RDI->m_name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_720 + 0x22));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6fd);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6fc);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_6fb);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff718);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_198;
  puVar1 = local_110;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(this);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff718);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_3f8;
  puVar1 = local_1d8;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(this);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff718);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6da);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff718);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_6c8 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff718);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_6a8 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_699);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff718);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_672);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_671);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_652);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_651);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_632);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff718);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_5fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_5fa + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getchaintips()
{
    return RPCHelpMan{"getchaintips",
                "Return information about all known tips in the block tree,"
                " including the main chain as well as orphaned branches.\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {{RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::NUM, "height", "height of the chain tip"},
                            {RPCResult::Type::STR_HEX, "hash", "block hash of the tip"},
                            {RPCResult::Type::NUM, "branchlen", "zero for main chain, otherwise length of branch connecting the tip to the main chain"},
                            {RPCResult::Type::STR, "status", "status of the chain, \"active\" for the main chain\n"
            "Possible values for status:\n"
            "1.  \"invalid\"               This branch contains at least one invalid block\n"
            "2.  \"headers-only\"          Not all blocks for this branch are available, but the headers are valid\n"
            "3.  \"valid-headers\"         All blocks are available for this branch, but they were never fully validated\n"
            "4.  \"valid-fork\"            This branch is not part of the active chain, but is fully validated\n"
            "5.  \"active\"                This is the tip of the active main chain, which is certainly valid"},
                        }}}},
                RPCExamples{
                    HelpExampleCli("getchaintips", "")
            + HelpExampleRpc("getchaintips", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    LOCK(cs_main);
    CChain& active_chain = chainman.ActiveChain();

    /*
     * Idea: The set of chain tips is the active chain tip, plus orphan blocks which do not have another orphan building off of them.
     * Algorithm:
     *  - Make one pass through BlockIndex(), picking out the orphan blocks, and also storing a set of the orphan block's pprev pointers.
     *  - Iterate through the orphan blocks. If the block isn't pointed to by another orphan, it is a chain tip.
     *  - Add the active chain tip
     */
    std::set<const CBlockIndex*, CompareBlocksByHeight> setTips;
    std::set<const CBlockIndex*> setOrphans;
    std::set<const CBlockIndex*> setPrevs;

    for (const auto& [_, block_index] : chainman.BlockIndex()) {
        if (!active_chain.Contains(&block_index)) {
            setOrphans.insert(&block_index);
            setPrevs.insert(block_index.pprev);
        }
    }

    for (std::set<const CBlockIndex*>::iterator it = setOrphans.begin(); it != setOrphans.end(); ++it) {
        if (setPrevs.erase(*it) == 0) {
            setTips.insert(*it);
        }
    }

    // Always report the currently active tip.
    setTips.insert(active_chain.Tip());

    /* Construct the output array.  */
    UniValue res(UniValue::VARR);
    for (const CBlockIndex* block : setTips) {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("height", block->nHeight);
        obj.pushKV("hash", block->phashBlock->GetHex());

        const int branchLen = block->nHeight - active_chain.FindFork(block)->nHeight;
        obj.pushKV("branchlen", branchLen);

        std::string status;
        if (active_chain.Contains(block)) {
            // This block is part of the currently active chain.
            status = "active";
        } else if (block->nStatus & BLOCK_FAILED_MASK) {
            // This block or one of its ancestors is invalid.
            status = "invalid";
        } else if (!block->HaveNumChainTxs()) {
            // This block cannot be connected because full block data for it or one of its parents is missing.
            status = "headers-only";
        } else if (block->IsValid(BLOCK_VALID_SCRIPTS)) {
            // This block is fully validated, but no longer part of the active chain. It was probably the active block once, but was reorganized.
            status = "valid-fork";
        } else if (block->IsValid(BLOCK_VALID_TREE)) {
            // The headers for this block are valid, but it has not been validated. It was probably never part of the most-work chain.
            status = "valid-headers";
        } else {
            // No clue.
            status = "unknown";
        }
        obj.pushKV("status", status);

        res.push_back(std::move(obj));
    }

    return res;
},
    };
}